

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::
InitDefaultSignature<Diligent::SHADER_TYPE,bool>
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,
          PipelineResourceSignatureDesc *SignDesc,SHADER_TYPE *ExtraArgs,bool *ExtraArgs_1)

{
  bool bVar1;
  Char *pCVar2;
  RenderDeviceVkImpl *this_00;
  IPipelineResourceSignature **ppSignature;
  PipelineResourceSignatureVkImpl *this_01;
  PipelineResourceSignatureDesc *pPVar3;
  char (*Args_1) [48];
  undefined1 local_b0 [8];
  string msg_2;
  string msg_1;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> local_60;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> pImplicitSignature;
  undefined1 local_48 [8];
  string msg;
  bool *ExtraArgs_local_1;
  SHADER_TYPE *ExtraArgs_local;
  PipelineResourceSignatureDesc *SignDesc_local;
  PipelineStateBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = ExtraArgs_1;
  if ((this->m_SignatureCount != '\x01') || ((this->m_UsingImplicitSignature & 1U) == 0)) {
    FormatString<char[26],char[50]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_SignatureCount == 1 && m_UsingImplicitSignature",
               (char (*) [50])ExtraArgs_1);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"InitDefaultSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x478);
    std::__cxx11::string::~string((string *)local_48);
  }
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::RefCntAutoPtr(&local_60);
  this_00 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
            ::GetDevice(&this->
                         super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                       );
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::
  DblPtr<Diligent::IPipelineResourceSignature,void>
            ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)
             (msg_1.field_2._M_local_buf + 8));
  ppSignature = Diligent::RefCntAutoPtr::DoublePtrHelper::
                operator_cast_to_IPipelineResourceSignature__
                          ((DoublePtrHelper *)(msg_1.field_2._M_local_buf + 8));
  Args_1 = (char (*) [48])(ulong)*ExtraArgs;
  RenderDeviceVkImpl::CreatePipelineResourceSignature
            (this_00,SignDesc,ppSignature,*ExtraArgs,(bool)(*(byte *)msg.field_2._8_8_ & 1));
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::
  DoublePtrHelper<Diligent::IPipelineResourceSignature>::~DoublePtrHelper
            ((DoublePtrHelper<Diligent::IPipelineResourceSignature> *)((long)&msg_1.field_2 + 8));
  bVar1 = RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator!(&local_60);
  if (bVar1) {
    Args_1 = (char (*) [48])0x47e;
    LogError<true,char[66],char_const*,char[3]>
              (false,"InitDefaultSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x47e,(char (*) [66])
                      "Failed to create implicit resource signature for pipeline state \'",
               (char **)&(this->
                         super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                         ).m_Desc,(char (*) [3])"\'.");
  }
  this_01 = RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator->(&local_60);
  pPVar3 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
           ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                      *)this_01);
  if (pPVar3->BindingIndex != '\0') {
    FormatString<char[26],char[48]>
              ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pImplicitSignature->GetDesc().BindingIndex == 0",Args_1);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"InitDefaultSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x480);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  bVar1 = RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator!(this->m_Signatures);
  if (!bVar1) {
    FormatString<char[42]>
              ((string *)local_b0,(char (*) [42])"Signature 0 has already been initialized.");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"InitDefaultSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x481);
    std::__cxx11::string::~string((string *)local_b0);
  }
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::operator=(this->m_Signatures,&local_60);
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::~RefCntAutoPtr(&local_60);
  return;
}

Assistant:

void InitDefaultSignature(const PipelineResourceSignatureDesc& SignDesc,
                              const ExtraArgsType&... ExtraArgs)
    {
        VERIFY_EXPR(m_SignatureCount == 1 && m_UsingImplicitSignature);

        RefCntAutoPtr<PipelineResourceSignatureImplType> pImplicitSignature;
        this->GetDevice()->CreatePipelineResourceSignature(SignDesc, pImplicitSignature.template DblPtr<IPipelineResourceSignature>(), ExtraArgs...);

        if (!pImplicitSignature)
            LOG_ERROR_AND_THROW("Failed to create implicit resource signature for pipeline state '", this->m_Desc.Name, "'.");

        VERIFY_EXPR(pImplicitSignature->GetDesc().BindingIndex == 0);
        VERIFY(!m_Signatures[0], "Signature 0 has already been initialized.");
        m_Signatures[0] = std::move(pImplicitSignature);
    }